

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveDisplayer.cpp
# Opt level: O3

GLfloat * __thiscall
PrimitiveDisplayer::getRotatedVertices(PrimitiveDisplayer *this,GLfloat blockSize,float angle)

{
  GLfloat *pGVar1;
  Vec2d *pVVar2;
  ulong uVar3;
  float fVar4;
  
  pGVar1 = (GLfloat *)operator_new__(0x20);
  uVar3 = 0xfffffffffffffffe;
  do {
    pVVar2 = Vec2d::getRotation(*(Vec2d **)((long)this->verticesVec + uVar3 * 4 + 8),Vec2d::ORIGIN,
                                angle);
    pVVar2 = Vec2d::withScale(pVVar2,blockSize);
    fVar4 = Vec2d::getX(pVVar2);
    pGVar1[uVar3 + 2] = fVar4;
    fVar4 = Vec2d::getY(pVVar2);
    pGVar1[uVar3 + 3] = fVar4;
    operator_delete(pVVar2);
    uVar3 = uVar3 + 2;
  } while (uVar3 < 6);
  return pGVar1;
}

Assistant:

GLfloat* PrimitiveDisplayer::getRotatedVertices(GLfloat blockSize, float angle) {
    GLfloat* vertices = new GLfloat[8];
    
    for (int i=0; i < 8; i+=2) {
        Vec2d* rotatedCoord = verticesVec[i/2]->getRotation(Vec2d::ORIGIN, angle)->withScale(blockSize);
        
        vertices[i] = rotatedCoord->getX();
        vertices[i+1] = rotatedCoord->getY();
        
        delete rotatedCoord;
        rotatedCoord = nullptr;
    }
    
    return vertices;
}